

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)'\x02'>::basic_dynamic_gauge
          (basic_dynamic_gauge<double,_(unsigned_char)__x02_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  _Alloc_hider in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined8 in_RSI;
  metric_t *in_RDI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *paVar1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_00;
  
  paVar1 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
            *)&stack0xffffffffffffffc0;
  name_00 = in_RDX;
  std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_00 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
             *)&stack0xffffffffffffffa0;
  std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  array(this_00,paVar1);
  basic_dynamic_counter<double,_(unsigned_char)'\x02'>::basic_dynamic_counter
            ((basic_dynamic_counter<double,_(unsigned_char)__x02_> *)in_RSI,name_00,
             (string *)in_RCX._M_p,
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)in_stack_ffffffffffffffd8);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *)in_RDI);
  std::__cxx11::string::~string(in_RDX);
  std::__cxx11::string::~string(in_RDX);
  in_RDI->_vptr_metric_t = (_func_int **)&PTR__basic_dynamic_gauge_0032b928;
  metric_t::set_metric_type(in_RDI,Gauge);
  return;
}

Assistant:

basic_dynamic_gauge(std::string name, std::string help,
                      std::array<std::string, N> labels_name)
      : Base(std::move(name), std::move(help), std::move(labels_name)) {
    set_metric_type(MetricType::Gauge);
  }